

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

void smtp_get_message(char *buffer,char **outptr)

{
  char *pcVar1;
  bool bVar2;
  char *local_28;
  char *message;
  size_t len;
  char **outptr_local;
  char *buffer_local;
  
  local_28 = buffer + 4;
  while( true ) {
    bVar2 = true;
    if (*local_28 != ' ') {
      bVar2 = *local_28 == '\t';
    }
    if (!bVar2) break;
    local_28 = local_28 + 1;
  }
  pcVar1 = (char *)strlen(local_28);
  do {
    message = pcVar1;
    pcVar1 = message + -1;
    if (message == (char *)0x0) break;
  } while ((((local_28[(long)pcVar1] == '\r') || (local_28[(long)pcVar1] == '\n')) ||
           (local_28[(long)pcVar1] == ' ')) || (local_28[(long)pcVar1] == '\t'));
  if (message != (char *)0x0) {
    local_28[(long)message] = '\0';
  }
  *outptr = local_28;
  return;
}

Assistant:

static void smtp_get_message(char *buffer, char** outptr)
{
  size_t len = 0;
  char* message = NULL;

  /* Find the start of the message */
  for(message = buffer + 4; *message == ' ' || *message == '\t'; message++)
    ;

  /* Find the end of the message */
  for(len = strlen(message); len--;)
    if(message[len] != '\r' && message[len] != '\n' && message[len] != ' ' &&
        message[len] != '\t')
      break;

  /* Terminate the message */
  if(++len) {
    message[len] = '\0';
  }

  *outptr = message;
}